

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O3

Vertex * __thiscall MeshLib::Solid::edgeSplit(Solid *this,Edge *e)

{
  int *piVar1;
  int iVar2;
  Face *pFVar3;
  pointer pcVar4;
  Edge *pEVar5;
  HalfEdge *pHVar6;
  ulong uVar7;
  int i;
  tVertex pVVar8;
  Node<MeshLib::Edge> *pNVar9;
  HalfEdge **ppHVar10;
  Node<MeshLib::Face> *pNVar11;
  long lVar12;
  long lVar13;
  tFace pFVar14;
  ListNode<MeshLib::Face> *pLVar15;
  ListNode<MeshLib::Face> *pLVar16;
  List<MeshLib::Face> *pLVar17;
  List<MeshLib::Face> *pLVar18;
  Tree<MeshLib::Face> *pTVar19;
  undefined8 extraout_RDX;
  ListNode<MeshLib::Face> *pLVar20;
  ulong uVar21;
  HalfEdge *pHVar22;
  int iVar23;
  HalfEdge *pHVar24;
  int iVar25;
  List<MeshLib::Face> new_faces;
  tVertex w [3];
  int vid [3];
  tVertex v [3];
  TreeIterator<MeshLib::Face> fiter;
  TreeIterator<MeshLib::Vertex> viter;
  List<MeshLib::Face> local_2f0;
  Edge *local_2e0;
  uint local_2d4;
  Tree<MeshLib::Face> *local_2d0;
  tVertex local_2c8;
  long local_2c0;
  undefined8 local_2b8;
  int local_2a4 [3];
  HalfEdge *local_298 [2];
  Solid *local_288;
  HalfEdge *local_280;
  long local_278 [3];
  TreeIterator<MeshLib::Face> local_260;
  TreeIterator<MeshLib::Vertex> local_148;
  
  local_2e0 = e;
  AVL::TreeIterator<MeshLib::Vertex>::TreeIterator(&local_148,&this->m_verts);
  iVar23 = 0;
  if (local_148.m_finished == false) {
    iVar23 = -1;
    do {
      iVar25 = (local_148.m_pointer)->data->m_id;
      if (iVar25 < iVar23) {
        iVar25 = iVar23;
      }
      iVar23 = iVar25;
      AVL::TreeIterator<MeshLib::Vertex>::operator++(&local_148);
    } while (local_148.m_finished != true);
    iVar23 = iVar23 + 1;
  }
  local_2d0 = &this->m_faces;
  AVL::TreeIterator<MeshLib::Face>::TreeIterator(&local_260,local_2d0);
  iVar25 = -1;
  if (local_260.m_finished == false) {
    iVar25 = -1;
    do {
      iVar2 = (local_260.m_pointer)->data->m_id;
      if (iVar25 <= iVar2) {
        iVar25 = iVar2;
      }
      AVL::TreeIterator<MeshLib::Face>::operator++(&local_260);
    } while (local_260.m_finished != true);
  }
  pVVar8 = createVertex(this,iVar23);
  local_298[0] = local_2e0->m_halfedge[0];
  local_280 = local_2e0->m_halfedge[1];
  pVVar8->m_boundary = local_280 == (HalfEdge *)0x0;
  pNVar9 = AVL::Node<MeshLib::Edge>::remove_node((this->m_edges).root,local_2e0);
  (this->m_edges).root = pNVar9;
  if (pNVar9 != (Node<MeshLib::Edge> *)0x0) {
    piVar1 = &(this->m_edges).size;
    *piVar1 = *piVar1 + -1;
  }
  local_2f0.m_head = (ListNode<MeshLib::Face> *)0x0;
  local_2f0.m_size = 0;
  ppHVar10 = local_298;
  uVar21 = CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  local_288 = this;
  pTVar19 = local_2d0;
  do {
    pHVar22 = *ppHVar10;
    if (pHVar22 != (HalfEdge *)0x0) {
      local_2d4 = (uint)uVar21;
      pFVar3 = pHVar22->m_face;
      pNVar11 = AVL::Node<MeshLib::Face>::remove_node(pTVar19->root,pFVar3);
      pTVar19->root = pNVar11;
      if (pNVar11 != (Node<MeshLib::Face> *)0x0) {
        piVar1 = &(this->m_faces).size;
        *piVar1 = *piVar1 + -1;
      }
      if ((pFVar3 != (Face *)0x0) &&
         (pcVar4 = (pFVar3->m_string)._M_dataplus._M_p,
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)pcVar4 != &(pFVar3->m_string).field_2)) {
        operator_delete(pcVar4);
      }
      operator_delete(pFVar3);
      lVar12 = 0;
      do {
        local_278[lVar12] = (long)pHVar22->m_vertex;
        pEVar5 = pHVar22->m_edge;
        if (pEVar5->m_halfedge[0] == pHVar22) {
          pEVar5->m_halfedge[0] = pEVar5->m_halfedge[1];
        }
        pEVar5->m_halfedge[1] = (HalfEdge *)0x0;
        pHVar22 = pHVar22->m_next;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      iVar23 = 3;
      do {
        pHVar24 = pHVar22->m_next;
        pcVar4 = (pHVar22->m_string)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar4 != &(pHVar22->m_string).field_2) {
          operator_delete(pcVar4);
        }
        operator_delete(pHVar22);
        lVar12 = local_278[1];
        this = local_288;
        iVar23 = iVar23 + -1;
        pHVar22 = pHVar24;
      } while (iVar23 != 0);
      local_2c8 = pVVar8;
      local_2c0 = local_278[0];
      local_2b8 = local_278[1];
      lVar13 = 0;
      do {
        local_2a4[lVar13] = (&local_2c8)[lVar13]->m_id;
        lVar13 = lVar13 + 1;
      } while (lVar13 != 3);
      pFVar14 = createFace(local_288,local_2a4,iVar25 + 1);
      pLVar18 = &local_2f0;
      pLVar15 = (ListNode<MeshLib::Face> *)operator_new(0x10);
      pLVar15->m_data = pFVar14;
      pLVar17 = pLVar18;
      pLVar16 = local_2f0.m_head;
      if (local_2f0.m_head != (ListNode<MeshLib::Face> *)0x0) {
        do {
          pLVar20 = pLVar16;
          pLVar16 = pLVar20->m_next;
        } while (pLVar16 != (ListNode<MeshLib::Face> *)0x0);
        pLVar17 = (List<MeshLib::Face> *)&pLVar20->m_next;
      }
      pLVar17->m_head = pLVar15;
      pLVar15->m_next = (ListNode<MeshLib::Face> *)0x0;
      local_2f0.m_size = local_2f0.m_size + 1;
      local_2c8 = pVVar8;
      local_2c0 = lVar12;
      local_2b8 = local_278[2];
      lVar12 = 0;
      do {
        local_2a4[lVar12] = (&local_2c8)[lVar12]->m_id;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      iVar25 = iVar25 + 2;
      pFVar14 = createFace(this,local_2a4,iVar25);
      pLVar15 = (ListNode<MeshLib::Face> *)operator_new(0x10);
      pLVar15->m_data = pFVar14;
      pLVar16 = local_2f0.m_head;
      if (local_2f0.m_head != (ListNode<MeshLib::Face> *)0x0) {
        do {
          pLVar20 = pLVar16;
          pLVar16 = pLVar20->m_next;
        } while (pLVar16 != (ListNode<MeshLib::Face> *)0x0);
        pLVar18 = (List<MeshLib::Face> *)&pLVar20->m_next;
      }
      pLVar18->m_head = pLVar15;
      pLVar15->m_next = (ListNode<MeshLib::Face> *)0x0;
      local_2f0.m_size = local_2f0.m_size + 1;
      uVar21 = (ulong)local_2d4;
      pTVar19 = local_2d0;
    }
    ppHVar10 = &local_280;
    uVar7 = uVar21 & 1;
    uVar21 = 0;
    pLVar16 = local_2f0.m_head;
  } while (uVar7 != 0);
  for (; pLVar16 != (ListNode<MeshLib::Face> *)0x0; pLVar16 = pLVar16->m_next) {
    pFVar3 = pLVar16->m_data;
    pHVar22 = pFVar3->m_halfedge;
    pHVar24 = pHVar22;
    do {
      pEVar5 = pHVar22->m_edge;
      if ((pEVar5->m_halfedge[1] != (HalfEdge *)0x0) &&
         (pHVar6 = pEVar5->m_halfedge[0], pHVar6->m_vertex->m_id < pHVar6->m_prev->m_vertex->m_id))
      {
        pEVar5->m_halfedge[0] = pEVar5->m_halfedge[1];
        pEVar5->m_halfedge[1] = pHVar6;
        pHVar24 = pFVar3->m_halfedge;
      }
      pHVar22 = pHVar22->m_next;
    } while (pHVar22 != pHVar24);
  }
  pcVar4 = (local_2e0->m_string)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 != &(local_2e0->m_string).field_2) {
    operator_delete(pcVar4);
  }
  operator_delete(local_2e0);
  List<MeshLib::Face>::~List(&local_2f0);
  return pVVar8;
}

Assistant:

Vertex * Solid::edgeSplit( Edge * e )
{
	//find the max_id for vertices;

	AVL::TreeIterator<Vertex> viter(m_verts);

	int max_vid = -1;

	for( ; !viter.end(); ++viter )
	{
		max_vid = ( max_vid > (*viter)->id() )? max_vid: (*viter)->id();
	}

	AVL::TreeIterator<Face> fiter(m_faces);

	int max_fid = -1;

	for( ; !fiter.end(); ++fiter )
	{
		max_fid = ( max_fid > (*fiter)->id() )? max_fid: (*fiter)->id();
	}

	//create a new vertex

	tVertex nv = createVertex( ++max_vid );

	tHalfEdge hes[2];
	hes[0] = e->halfedge(0);
	hes[1] = e->halfedge(1);

	nv->boundary() = (hes[1]==NULL);

	m_edges.remove( e );


	List<Face> new_faces;

	for( int j = 0; j < 2; j ++ )
	{
		tVertex v[3];
		tHalfEdge he = hes[j];

		if( he == NULL ) continue;

		tFace  f = he->face();
		m_faces.remove( f );
		delete f;

		for( int i = 0; i < 3; i ++ )
		{
			v[i] = he->target();
			
			tEdge te = he->edge();
			if( te->halfedge(0) == he )
			{
				te->halfedge(0) = te->halfedge(1);
			}
			te->halfedge(1) = NULL;

			he = he->he_next();
		}

		int k;
		for( k = 0; k < 3; k ++ )
		{
			tHalfEdge ne = he->he_next();
			delete he;
			he = ne;
		}

		int vid[3];
		tVertex w[3];
		w[0] = nv; w[1] = v[0]; w[2] = v[1];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}		

		Face * nf = createFace( vid, ++max_fid );
		new_faces.Append( nf );

		w[0] = nv; w[1] = v[1]; w[2] = v[2];
		for( k = 0; k < 3; k ++ )
		{
			vid[k] = w[k]->id(); 
		}	
		nf = createFace( vid, ++ max_fid );
		new_faces.Append( nf );
	}	


	for( ListIterator<Face> iter( new_faces ); !iter.end(); ++ iter )
	{
		Face * f = *iter;
		HalfEdge * he = f->halfedge();

		do{
			Edge     * e = he->edge();
			if( e->halfedge(1) != NULL )
			{
				HalfEdge * h = e->halfedge(0);
				if( h->target()->id() < h->source()->id() )
				{
					e->halfedge(0) = e->halfedge(1);
					e->halfedge(1) = h;
				}
			}
			he = he->he_next();
		}while( he != f->halfedge() );
	}

	delete e;
	return nv;	
}